

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter2.cpp
# Opt level: O0

chapter2 * __thiscall chapter2::max(chapter2 *this,string *parray,int size)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  int size_local;
  string *parray_local;
  
  pbVar1 = std::max_element<std::__cxx11::string_const*>(parray,parray + (long)size * 0x20);
  std::__cxx11::string::string((string *)this,(string *)pbVar1);
  return this;
}

Assistant:

string max(const string *parray, int size) {
        return *max_element(parray, parray + size);
    }